

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

ssh2_userkey * ppk_load_s(BinarySource *src,char *passphrase,char **errorstr)

{
  BinarySink *bs;
  byte bVar1;
  uint uVar2;
  bool bVar3;
  ptrlen data;
  ptrlen pVar4;
  ptrlen pVar5;
  byte *pbVar6;
  ptrlen passphrase_salt;
  char cVar7;
  char **ppcVar8;
  _Bool _Var9;
  int iVar10;
  char *pcVar11;
  ssh_keyalg *psVar12;
  char *str;
  char *pcVar13;
  strbuf *buf_o;
  strbuf *buf_o_00;
  strbuf *storage;
  size_t sVar14;
  ssh2_macalg *psVar15;
  byte *ptr;
  ssh2_mac *psVar16;
  ssh_key *psVar17;
  ushort *puVar18;
  char *pcVar19;
  Argon2Flavour AVar20;
  undefined4 uVar21;
  undefined8 unaff_R13;
  ppk_cipher *ppVar22;
  ulong uVar23;
  ssh2_userkey *ptr_00;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ptrlen passphrase_00;
  char header [40];
  ppk_save_parameters params;
  ptrlen mackey;
  ptrlen cipheriv;
  ptrlen cipherkey;
  uchar binary [32];
  char s [3];
  strbuf *local_190;
  uint local_180;
  char local_178;
  char cStack_177;
  char cStack_176;
  char cStack_175;
  char cStack_174;
  char cStack_173;
  char cStack_172;
  char cStack_171;
  char cStack_170;
  char cStack_16f;
  char cStack_16e;
  char cStack_16d;
  char cStack_16c;
  char cStack_16b;
  char cStack_16a;
  char cStack_169;
  char cStack_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  undefined4 local_150;
  uint local_14c;
  ppk_cipher *local_148;
  ushort **local_140;
  ssh_keyalg *local_138;
  strbuf *local_130;
  int local_124;
  BinarySink *local_120;
  char *local_118;
  char **local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  size_t local_e8;
  ptrlen local_d8;
  uchar *local_c8;
  size_t sStack_c0;
  ptrlen local_b8;
  ptrlen local_a8;
  byte local_98 [32];
  char local_78;
  byte local_77;
  undefined1 local_76;
  
  local_130 = strbuf_new();
  _Var9 = read_header(src,&local_178);
  local_110 = errorstr;
  if (_Var9) {
    auVar25[0] = -(cStack_172 == 'U');
    auVar25[1] = -(cStack_171 == 's');
    auVar25[2] = -(cStack_170 == 'e');
    auVar25[3] = -(cStack_16f == 'r');
    auVar25[4] = -(cStack_16e == '-');
    auVar25[5] = -(cStack_16d == 'K');
    auVar25[6] = -(cStack_16c == 'e');
    auVar25[7] = -(cStack_16b == 'y');
    auVar25[8] = -(cStack_16a == '-');
    auVar25[9] = -(cStack_169 == 'F');
    auVar25[10] = -(cStack_168 == 'i');
    auVar25[0xb] = -(cStack_167 == 'l');
    auVar25[0xc] = -(cStack_166 == 'e');
    auVar25[0xd] = -(cStack_165 == '-');
    auVar25[0xe] = -(cStack_164 == '3');
    auVar25[0xf] = -(cStack_163 == '\0');
    auVar28[0] = -(local_178 == 'P');
    auVar28[1] = -(cStack_177 == 'u');
    auVar28[2] = -(cStack_176 == 'T');
    auVar28[3] = -(cStack_175 == 'T');
    auVar28[4] = -(cStack_174 == 'Y');
    auVar28[5] = -(cStack_173 == '-');
    auVar28[6] = -(cStack_172 == 'U');
    auVar28[7] = -(cStack_171 == 's');
    auVar28[8] = -(cStack_170 == 'e');
    auVar28[9] = -(cStack_16f == 'r');
    auVar28[10] = -(cStack_16e == '-');
    auVar28[0xb] = -(cStack_16d == 'K');
    auVar28[0xc] = -(cStack_16c == 'e');
    auVar28[0xd] = -(cStack_16b == 'y');
    auVar28[0xe] = -(cStack_16a == '-');
    auVar28[0xf] = -(cStack_169 == 'F');
    auVar28 = auVar28 & auVar25;
    bVar24 = (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar24) {
      uVar21 = 0;
      local_180 = 3;
    }
    else {
      auVar29[0] = -(cStack_172 == 'U');
      auVar29[1] = -(cStack_171 == 's');
      auVar29[2] = -(cStack_170 == 'e');
      auVar29[3] = -(cStack_16f == 'r');
      auVar29[4] = -(cStack_16e == '-');
      auVar29[5] = -(cStack_16d == 'K');
      auVar29[6] = -(cStack_16c == 'e');
      auVar29[7] = -(cStack_16b == 'y');
      auVar29[8] = -(cStack_16a == '-');
      auVar29[9] = -(cStack_169 == 'F');
      auVar29[10] = -(cStack_168 == 'i');
      auVar29[0xb] = -(cStack_167 == 'l');
      auVar29[0xc] = -(cStack_166 == 'e');
      auVar29[0xd] = -(cStack_165 == '-');
      auVar29[0xe] = -(cStack_164 == '2');
      auVar29[0xf] = -(cStack_163 == '\0');
      auVar33[0] = -(local_178 == 'P');
      auVar33[1] = -(cStack_177 == 'u');
      auVar33[2] = -(cStack_176 == 'T');
      auVar33[3] = -(cStack_175 == 'T');
      auVar33[4] = -(cStack_174 == 'Y');
      auVar33[5] = -(cStack_173 == '-');
      auVar33[6] = -(cStack_172 == 'U');
      auVar33[7] = -(cStack_171 == 's');
      auVar33[8] = -(cStack_170 == 'e');
      auVar33[9] = -(cStack_16f == 'r');
      auVar33[10] = -(cStack_16e == '-');
      auVar33[0xb] = -(cStack_16d == 'K');
      auVar33[0xc] = -(cStack_16c == 'e');
      auVar33[0xd] = -(cStack_16b == 'y');
      auVar33[0xe] = -(cStack_16a == '-');
      auVar33[0xf] = -(cStack_169 == 'F');
      auVar29 = auVar29 & auVar33;
      if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff) {
        local_180 = 2;
        uVar21 = 0;
      }
      else {
        auVar30[0] = -(cStack_172 == 'U');
        auVar30[1] = -(cStack_171 == 's');
        auVar30[2] = -(cStack_170 == 'e');
        auVar30[3] = -(cStack_16f == 'r');
        auVar30[4] = -(cStack_16e == '-');
        auVar30[5] = -(cStack_16d == 'K');
        auVar30[6] = -(cStack_16c == 'e');
        auVar30[7] = -(cStack_16b == 'y');
        auVar30[8] = -(cStack_16a == '-');
        auVar30[9] = -(cStack_169 == 'F');
        auVar30[10] = -(cStack_168 == 'i');
        auVar30[0xb] = -(cStack_167 == 'l');
        auVar30[0xc] = -(cStack_166 == 'e');
        auVar30[0xd] = -(cStack_165 == '-');
        auVar30[0xe] = -(cStack_164 == '1');
        auVar30[0xf] = -(cStack_163 == '\0');
        auVar34[0] = -(local_178 == 'P');
        auVar34[1] = -(cStack_177 == 'u');
        auVar34[2] = -(cStack_176 == 'T');
        auVar34[3] = -(cStack_175 == 'T');
        auVar34[4] = -(cStack_174 == 'Y');
        auVar34[5] = -(cStack_173 == '-');
        auVar34[6] = -(cStack_172 == 'U');
        auVar34[7] = -(cStack_171 == 's');
        auVar34[8] = -(cStack_170 == 'e');
        auVar34[9] = -(cStack_16f == 'r');
        auVar34[10] = -(cStack_16e == '-');
        auVar34[0xb] = -(cStack_16d == 'K');
        auVar34[0xc] = -(cStack_16c == 'e');
        auVar34[0xd] = -(cStack_16b == 'y');
        auVar34[0xe] = -(cStack_16a == '-');
        auVar34[0xf] = -(cStack_169 == 'F');
        auVar30 = auVar30 & auVar34;
        if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff) {
          auVar26[0] = -(local_178 == 'P');
          auVar26[1] = -(cStack_177 == 'u');
          auVar26[2] = -(cStack_176 == 'T');
          auVar26[3] = -(cStack_175 == 'T');
          auVar26[4] = -(cStack_174 == 'Y');
          auVar26[5] = -(cStack_173 == '-');
          auVar26[6] = -(cStack_172 == 'U');
          auVar26[7] = -(cStack_171 == 's');
          auVar26[8] = -(cStack_170 == 'e');
          auVar26[9] = -(cStack_16f == 'r');
          auVar26[10] = -(cStack_16e == '-');
          auVar26[0xb] = -(cStack_16d == 'K');
          auVar26[0xc] = -(cStack_16c == 'e');
          auVar26[0xd] = -(cStack_16b == 'y');
          auVar26[0xe] = -(cStack_16a == '-');
          auVar26[0xf] = -(cStack_169 == 'F');
          auVar31[0] = -(cStack_168 == 'i');
          auVar31[1] = -(cStack_167 == 'l');
          auVar31[2] = -(cStack_166 == 'e');
          auVar31[3] = -(cStack_165 == '-');
          auVar31[4] = 0xff;
          auVar31[5] = 0xff;
          auVar31[6] = 0xff;
          auVar31[7] = 0xff;
          auVar31[8] = 0xff;
          auVar31[9] = 0xff;
          auVar31[10] = 0xff;
          auVar31[0xb] = 0xff;
          auVar31[0xc] = 0xff;
          auVar31[0xd] = 0xff;
          auVar31[0xe] = 0xff;
          auVar31[0xf] = 0xff;
          auVar31 = auVar31 & auVar26;
          local_190 = (strbuf *)0x139f80;
          if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff) {
            local_190 = (strbuf *)0x139f67;
          }
          goto LAB_0010e8e4;
        }
        old_keyfile_warning();
        local_180 = 1;
        uVar21 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
      }
    }
    pcVar11 = read_body(src);
    local_190 = (strbuf *)0x139f9e;
    if (pcVar11 != (char *)0x0) {
      local_118 = passphrase;
      psVar12 = find_pubkey_alg(pcVar11);
      safefree(pcVar11);
      if ((((psVar12 != (ssh_keyalg *)0x0) && (_Var9 = read_header(src,&local_178), _Var9)) &&
          (CONCAT17(cStack_16e,
                    CONCAT16(cStack_16f,
                             CONCAT15(cStack_170,
                                      CONCAT14(cStack_171,
                                               CONCAT13(cStack_172,
                                                        CONCAT12(cStack_173,
                                                                 CONCAT11(cStack_174,cStack_175)))))
                            )) == 0x6e6f6974707972 &&
           CONCAT17(cStack_171,
                    CONCAT16(cStack_172,
                             CONCAT15(cStack_173,
                                      CONCAT14(cStack_174,
                                               CONCAT13(cStack_175,
                                                        CONCAT12(cStack_176,
                                                                 CONCAT11(cStack_177,local_178))))))
                   ) == 0x6974707972636e45)) && (pcVar11 = read_body(src), pcVar11 != (char *)0x0))
      {
        local_150 = uVar21;
        local_124 = strcmp(pcVar11,"aes256-cbc");
        if (local_124 == 0) {
          ppVar22 = &ppk_cipher_aes256_cbc;
LAB_0010e9f0:
          local_138 = psVar12;
          _Var9 = read_header(src,&local_178);
          if (((!_Var9) ||
              (CONCAT17(cStack_171,
                        CONCAT16(cStack_172,
                                 CONCAT15(cStack_173,
                                          CONCAT14(cStack_174,
                                                   CONCAT13(cStack_175,
                                                            CONCAT12(cStack_176,
                                                                     CONCAT11(cStack_177,local_178))
                                                           ))))) != 0x746e656d6d6f43)) ||
             (local_148 = ppVar22, str = read_body(src), str == (char *)0x0)) goto LAB_0010ea9e;
          local_f8 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          local_e8 = 0;
          _Var9 = read_header(src,&local_178);
          if (((!_Var9) ||
              (CONCAT17(cStack_16c,
                        CONCAT16(cStack_16d,
                                 CONCAT15(cStack_16e,
                                          CONCAT14(cStack_16f,
                                                   CONCAT13(cStack_170,
                                                            CONCAT12(cStack_171,
                                                                     CONCAT11(cStack_172,cStack_173)
                                                                    )))))) != 0x73656e694c2d63 ||
               CONCAT17(cStack_171,
                        CONCAT16(cStack_172,
                                 CONCAT15(cStack_173,
                                          CONCAT14(cStack_174,
                                                   CONCAT13(cStack_175,
                                                            CONCAT12(cStack_176,
                                                                     CONCAT11(cStack_177,local_178))
                                                           ))))) != 0x4c2d63696c627550)) ||
             (pcVar13 = read_body(src), pcVar13 == (char *)0x0)) {
LAB_0010ea8d:
            buf_o_00 = (strbuf *)0x0;
            buf_o = (strbuf *)0x0;
LAB_0010ea95:
            storage = (strbuf *)0x0;
            ptr_00 = (ssh2_userkey *)0x0;
            pcVar13 = (char *)0x0;
            goto LAB_0010e8f6;
          }
          iVar10 = userkey_parse_line_counter(pcVar13);
          safefree(pcVar13);
          if (iVar10 < 0) goto LAB_0010ea8d;
          buf_o = strbuf_new();
          _Var9 = read_blob(src,iVar10,buf_o->binarysink_);
          if (!_Var9) {
LAB_0010ed3f:
            buf_o_00 = (strbuf *)0x0;
            goto LAB_0010ea95;
          }
          local_14c = (uint)!bVar24;
          if ((local_14c == 0) && (local_148->keylen != 0)) {
            _Var9 = read_header(src,&local_178);
            if ((_Var9) &&
               (CONCAT17(cStack_16a,
                         CONCAT16(cStack_16b,
                                  CONCAT15(cStack_16c,
                                           CONCAT14(cStack_16d,
                                                    CONCAT13(cStack_16e,
                                                             CONCAT12(cStack_16f,
                                                                      CONCAT11(cStack_170,cStack_171
                                                                              ))))))) ==
                0x6e6f6974617669 &&
                CONCAT17(cStack_171,
                         CONCAT16(cStack_172,
                                  CONCAT15(cStack_173,
                                           CONCAT14(cStack_174,
                                                    CONCAT13(cStack_175,
                                                             CONCAT12(cStack_176,
                                                                      CONCAT11(cStack_177,local_178)
                                                                     )))))) == 0x697265442d79654b))
            {
              pcVar13 = read_body(src);
              AVar20 = Argon2d;
              if (pcVar13 != (char *)0x0) {
                iVar10 = strcmp(pcVar13,"Argon2d");
                if (iVar10 != 0) {
                  iVar10 = strcmp(pcVar13,"Argon2i");
                  if (iVar10 == 0) {
                    AVar20 = Argon2i;
                  }
                  else {
                    iVar10 = strcmp(pcVar13,"Argon2id");
                    if (iVar10 != 0) {
                      safefree(pcVar13);
                      goto LAB_0010ed3f;
                    }
                    AVar20 = Argon2id;
                  }
                }
                local_108._4_4_ = AVar20;
                safefree(pcVar13);
                _Var9 = read_header(src,&local_178);
                if (((_Var9) &&
                    (CONCAT17(cStack_16b,
                              CONCAT16(cStack_16c,
                                       CONCAT15(cStack_16d,
                                                CONCAT14(cStack_16e,
                                                         CONCAT13(cStack_16f,
                                                                  CONCAT12(cStack_170,
                                                                           CONCAT11(cStack_171,
                                                                                    cStack_172))))))
                             ) == 0x79726f6d654d2d &&
                     CONCAT17(cStack_171,
                              CONCAT16(cStack_172,
                                       CONCAT15(cStack_173,
                                                CONCAT14(cStack_174,
                                                         CONCAT13(cStack_175,
                                                                  CONCAT12(cStack_176,
                                                                           CONCAT11(cStack_177,
                                                                                    local_178)))))))
                     == 0x4d2d326e6f677241)) && (pcVar13 = read_body(src), pcVar13 != (char *)0x0))
                {
                  _Var9 = str_to_uint32_t(pcVar13,(uint32_t *)(local_108 + 8));
                  safefree(pcVar13);
                  if (((_Var9) && (_Var9 = read_header(src,&local_178), _Var9)) &&
                     ((CONCAT17(cStack_16b,
                                CONCAT16(cStack_16c,
                                         CONCAT15(cStack_16d,
                                                  CONCAT14(cStack_16e,
                                                           CONCAT13(cStack_16f,
                                                                    CONCAT12(cStack_170,
                                                                             CONCAT11(cStack_171,
                                                                                      cStack_172))))
                                                 ))) == 0x7365737361502d &&
                       CONCAT17(cStack_171,
                                CONCAT16(cStack_172,
                                         CONCAT15(cStack_173,
                                                  CONCAT14(cStack_174,
                                                           CONCAT13(cStack_175,
                                                                    CONCAT12(cStack_176,
                                                                             CONCAT11(cStack_177,
                                                                                      local_178)))))
                                        )) == 0x502d326e6f677241 &&
                      (pcVar13 = read_body(src), pcVar13 != (char *)0x0)))) {
                    _Var9 = str_to_uint32_t(pcVar13,(uint32_t *)local_f8);
                    safefree(pcVar13);
                    if ((_Var9) && (_Var9 = read_header(src,&local_178), _Var9)) {
                      auVar32[0] = -(cStack_175 == 'o');
                      auVar32[1] = -(cStack_174 == 'n');
                      auVar32[2] = -(cStack_173 == '2');
                      auVar32[3] = -(cStack_172 == '-');
                      auVar32[4] = -(cStack_171 == 'P');
                      auVar32[5] = -(cStack_170 == 'a');
                      auVar32[6] = -(cStack_16f == 'r');
                      auVar32[7] = -(cStack_16e == 'a');
                      auVar32[8] = -(cStack_16d == 'l');
                      auVar32[9] = -(cStack_16c == 'l');
                      auVar32[10] = -(cStack_16b == 'e');
                      auVar32[0xb] = -(cStack_16a == 'l');
                      auVar32[0xc] = -(cStack_169 == 'i');
                      auVar32[0xd] = -(cStack_168 == 's');
                      auVar32[0xe] = -(cStack_167 == 'm');
                      auVar32[0xf] = -(cStack_166 == '\0');
                      auVar27[0] = -(local_178 == 'A');
                      auVar27[1] = -(cStack_177 == 'r');
                      auVar27[2] = -(cStack_176 == 'g');
                      auVar27[3] = -(cStack_175 == 'o');
                      auVar27[4] = -(cStack_174 == 'n');
                      auVar27[5] = -(cStack_173 == '2');
                      auVar27[6] = -(cStack_172 == '-');
                      auVar27[7] = -(cStack_171 == 'P');
                      auVar27[8] = -(cStack_170 == 'a');
                      auVar27[9] = -(cStack_16f == 'r');
                      auVar27[10] = -(cStack_16e == 'a');
                      auVar27[0xb] = -(cStack_16d == 'l');
                      auVar27[0xc] = -(cStack_16c == 'l');
                      auVar27[0xd] = -(cStack_16b == 'e');
                      auVar27[0xe] = -(cStack_16a == 'l');
                      auVar27[0xf] = -(cStack_169 == 'i');
                      auVar27 = auVar27 & auVar32;
                      if (((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff) &&
                         (pcVar13 = read_body(src), pcVar13 != (char *)0x0)) {
                        _Var9 = str_to_uint32_t(pcVar13,(uint32_t *)(local_f8 + 4));
                        safefree(pcVar13);
                        if ((((_Var9) && (_Var9 = read_header(src,&local_178), _Var9)) &&
                            (CONCAT13(cStack_16d,
                                      CONCAT12(cStack_16e,CONCAT11(cStack_16f,cStack_170))) ==
                             0x746c61 &&
                             CONCAT17(cStack_171,
                                      CONCAT16(cStack_172,
                                               CONCAT15(cStack_173,
                                                        CONCAT14(cStack_174,
                                                                 CONCAT13(cStack_175,
                                                                          CONCAT12(cStack_176,
                                                                                   CONCAT11(
                                                  cStack_177,local_178))))))) == 0x532d326e6f677241)
                            ) && (ptr = (byte *)read_body(src), ptr != (byte *)0x0)) {
                          uVar23 = (ulong)*ptr;
                          bVar24 = uVar23 == 0;
                          if (!bVar24) {
                            local_140 = __ctype_b_loc();
                            puVar18 = *local_140;
                            if ((*(byte *)((long)puVar18 + uVar23 * 2 + 1) & 0x10) != 0) {
                              local_120 = local_130->binarysink_;
                              pbVar6 = ptr;
                              do {
                                bVar1 = pbVar6[1];
                                if (((ulong)bVar1 == 0) ||
                                   ((*(byte *)((long)puVar18 + (ulong)bVar1 * 2 + 1) & 0x10) == 0))
                                break;
                                local_78 = (char)uVar23;
                                local_76 = 0;
                                local_77 = bVar1;
                                uVar23 = strtoul(&local_78,(char **)0x0,0x10);
                                BinarySink_put_byte(local_120,(uchar)uVar23);
                                uVar23 = (ulong)pbVar6[2];
                                bVar24 = uVar23 == 0;
                                if (bVar24) goto LAB_0010efad;
                                puVar18 = *local_140;
                                pbVar6 = pbVar6 + 2;
                              } while ((*(byte *)((long)puVar18 + uVar23 * 2 + 1) & 0x10) != 0);
                            }
                            safefree(ptr);
                            if (!bVar24) goto LAB_0010ed3f;
                          }
LAB_0010efad:
                          safefree(ptr);
                          goto LAB_0010eb0b;
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0010ed3f;
          }
LAB_0010eb0b:
          _Var9 = read_header(src,&local_178);
          if (((!_Var9) ||
              (CONCAT17(cStack_16b,
                        CONCAT16(cStack_16c,
                                 CONCAT15(cStack_16d,
                                          CONCAT14(cStack_16e,
                                                   CONCAT13(cStack_16f,
                                                            CONCAT12(cStack_170,
                                                                     CONCAT11(cStack_171,cStack_172)
                                                                    )))))) != 0x73656e694c2d65 ||
               CONCAT17(cStack_171,
                        CONCAT16(cStack_172,
                                 CONCAT15(cStack_173,
                                          CONCAT14(cStack_174,
                                                   CONCAT13(cStack_175,
                                                            CONCAT12(cStack_176,
                                                                     CONCAT11(cStack_177,local_178))
                                                           ))))) != 0x2d65746176697250)) ||
             (pcVar13 = read_body(src), pcVar13 == (char *)0x0)) goto LAB_0010ed3f;
          iVar10 = userkey_parse_line_counter(pcVar13);
          safefree(pcVar13);
          if (iVar10 < 0) goto LAB_0010ed3f;
          buf_o_00 = strbuf_new_nm();
          _Var9 = read_blob(src,iVar10,buf_o_00->binarysink_);
          if ((!_Var9) || (_Var9 = read_header(src,&local_178), !_Var9)) goto LAB_0010ea95;
          bVar24 = CONCAT13(cStack_16d,CONCAT12(cStack_16e,CONCAT11(cStack_16f,cStack_170))) !=
                   0x43414d;
          bVar3 = CONCAT17(cStack_171,
                           CONCAT16(cStack_172,
                                    CONCAT15(cStack_173,
                                             CONCAT14(cStack_174,
                                                      CONCAT13(cStack_175,
                                                               CONCAT12(cStack_176,
                                                                        CONCAT11(cStack_177,
                                                                                 local_178))))))) !=
                  0x2d65746176697250;
          local_140 = (ushort **)CONCAT71(local_140._1_7_,bVar24 || bVar3);
          if (((bVar24 || bVar3) &&
              ((char)local_150 != '\x01' ||
               (CONCAT17(cStack_16c,
                         CONCAT16(cStack_16d,
                                  CONCAT15(cStack_16e,
                                           CONCAT14(cStack_16f,
                                                    CONCAT13(cStack_170,
                                                             CONCAT12(cStack_171,
                                                                      CONCAT11(cStack_172,cStack_173
                                                                              ))))))) !=
                0x687361482d6574 ||
               CONCAT17(cStack_171,
                        CONCAT16(cStack_172,
                                 CONCAT15(cStack_173,
                                          CONCAT14(cStack_174,
                                                   CONCAT13(cStack_175,
                                                            CONCAT12(cStack_176,
                                                                     CONCAT11(cStack_177,local_178))
                                                           ))))) != 0x2d65746176697250))) ||
             (pcVar13 = read_body(src), pcVar13 == (char *)0x0)) goto LAB_0010ea95;
          storage = strbuf_new();
          pcVar19 = "";
          if (local_118 != (char *)0x0) {
            pcVar19 = local_118;
          }
          sVar14 = strlen(pcVar19);
          local_c8 = local_130->u;
          sStack_c0 = local_130->len;
          passphrase_salt.ptr = local_130->u;
          passphrase_salt.len = local_130->len;
          passphrase_00.len = sVar14;
          passphrase_00.ptr = pcVar19;
          ssh2_ppk_derive_keys
                    (local_180,local_148,passphrase_00,storage,&local_a8,&local_b8,&local_d8,
                     passphrase_salt,(ppk_save_parameters *)local_108);
          ptr_00 = (ssh2_userkey *)0x0;
          if (buf_o_00->len % local_148->blocklen != 0) goto LAB_0010e8f6;
          if (local_124 == 0) {
            aes256_decrypt_pubkey(local_a8.ptr,local_b8.ptr,buf_o_00->u,(int)buf_o_00->len);
          }
          if (local_14c == 0) {
            psVar15 = &ssh_hmac_sha256;
          }
          else {
            psVar15 = &ssh_hmac_sha1;
          }
          cVar7 = (char)local_140;
          local_190 = buf_o_00;
          if ((char)local_150 == '\0') {
            local_190 = strbuf_new_nm();
            bs = local_190->binarysink_;
            BinarySink_put_stringz(bs,local_138->ssh_id);
            BinarySink_put_stringz(bs,pcVar11);
            BinarySink_put_stringz(bs,str);
            BinarySink_put_string(bs,buf_o->s,buf_o->len);
            BinarySink_put_string(bs,buf_o_00->s,buf_o_00->len);
          }
          if (cVar7 == '\0') {
            psVar16 = (*psVar15->new)(psVar15,(ssh_cipher *)0x0);
            (*psVar16->vt->setkey)(psVar16,local_d8);
            (*psVar16->vt->start)(psVar16);
            BinarySink_put_data(psVar16->binarysink_,local_190->s,local_190->len);
            (*psVar16->vt->genresult)(psVar16,local_98);
            (*psVar16->vt->free)(psVar16);
          }
          else {
            data.ptr = local_190->u;
            data.len = local_190->len;
            hash_simple(&ssh_sha1,data,local_98);
          }
          if ((char)local_150 == '\0') {
            strbuf_free(local_190);
          }
          if (local_14c == 0) {
            psVar15 = &ssh_hmac_sha256;
          }
          else {
            psVar15 = &ssh_hmac_sha1;
          }
          uVar2 = psVar15->len;
          if (0 < (int)uVar2) {
            pcVar19 = &local_78;
            uVar23 = 0;
            do {
              sprintf(pcVar19,"%02x",(ulong)local_98[uVar23]);
              uVar23 = uVar23 + 1;
              pcVar19 = pcVar19 + 2;
            } while (uVar2 != uVar23);
          }
          iVar10 = strcmp(pcVar13,&local_78);
          if (iVar10 == 0) {
            local_190 = (strbuf *)0x139f9e;
            ptr_00 = (ssh2_userkey *)0x0;
          }
          else {
            bVar24 = local_148->keylen == 0;
            local_190 = (strbuf *)0x138a67;
            if (bVar24) {
              local_190 = (strbuf *)0x13a051;
            }
            ptr_00 = &ssh2_wrong_passphrase;
            if (bVar24) {
              ptr_00 = (ssh2_userkey *)0x0;
            }
          }
          if (iVar10 != 0) goto LAB_0010e8f6;
          local_190 = (strbuf *)0x0;
          ptr_00 = (ssh2_userkey *)safemalloc(1,0x10,0);
          ptr_00->comment = str;
          pVar4.ptr = buf_o->u;
          pVar4.len = buf_o->len;
          pVar5.ptr = buf_o_00->u;
          pVar5.len = buf_o_00->len;
          psVar17 = (*local_138->new_priv)(local_138,pVar4,pVar5);
          ptr_00->key = psVar17;
          if (psVar17 == (ssh_key *)0x0) {
            safefree(ptr_00);
            local_190 = (strbuf *)0x13a05c;
            ptr_00 = (ssh2_userkey *)0x0;
          }
        }
        else {
          iVar10 = strcmp(pcVar11,"none");
          if (iVar10 == 0) {
            ppVar22 = &ppk_cipher_none;
            goto LAB_0010e9f0;
          }
LAB_0010ea9e:
          storage = (strbuf *)0x0;
          buf_o_00 = (strbuf *)0x0;
          buf_o = (strbuf *)0x0;
          ptr_00 = (ssh2_userkey *)0x0;
          pcVar13 = (char *)0x0;
        }
        str = (char *)0x0;
        goto LAB_0010e8f6;
      }
    }
  }
  else {
    local_190 = (strbuf *)0x139eef;
  }
LAB_0010e8e4:
  storage = (strbuf *)0x0;
  buf_o_00 = (strbuf *)0x0;
  buf_o = (strbuf *)0x0;
  ptr_00 = (ssh2_userkey *)0x0;
  pcVar13 = (char *)0x0;
  str = (char *)0x0;
  pcVar11 = (char *)0x0;
LAB_0010e8f6:
  if (str != (char *)0x0) {
    safefree(str);
  }
  if (pcVar11 != (char *)0x0) {
    safefree(pcVar11);
  }
  if (pcVar13 != (char *)0x0) {
    safefree(pcVar13);
  }
  if (buf_o != (strbuf *)0x0) {
    strbuf_free(buf_o);
  }
  if (buf_o_00 != (strbuf *)0x0) {
    strbuf_free(buf_o_00);
  }
  ppcVar8 = local_110;
  if (storage != (strbuf *)0x0) {
    strbuf_free(storage);
  }
  strbuf_free(local_130);
  if (ppcVar8 != (char **)0x0) {
    *ppcVar8 = (char *)local_190;
  }
  return ptr_00;
}

Assistant:

ssh2_userkey *ppk_load_s(BinarySource *src, const char *passphrase,
                         const char **errorstr)
{
    char header[40], *b, *encryption, *comment, *mac;
    const ssh_keyalg *alg;
    ssh2_userkey *ret;
    strbuf *public_blob, *private_blob, *cipher_mac_keys_blob;
    strbuf *passphrase_salt = strbuf_new();
    ptrlen cipherkey, cipheriv, mackey;
    const struct ppk_cipher *ciphertype;
    int i;
    bool is_mac;
    unsigned fmt_version;
    const char *error = NULL;
    ppk_save_parameters params;

    ret = NULL;                        /* return NULL for most errors */
    encryption = comment = mac = NULL;
    public_blob = private_blob = cipher_mac_keys_blob = NULL;

    /* Read the first header line which contains the key type. */
    if (!read_header(src, header)) {
        error = "no header line found in key file";
        goto error;
    }
    if (0 == strcmp(header, "PuTTY-User-Key-File-3")) {
        fmt_version = 3;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-2")) {
        fmt_version = 2;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-1")) {
        /* this is an old key file; warn and then continue */
        old_keyfile_warning();
        fmt_version = 1;
    } else if (0 == strncmp(header, "PuTTY-User-Key-File-", 20)) {
        /* this is a key file FROM THE FUTURE; refuse it, but with a
         * more specific error message than the generic one below */
        error = "PuTTY key format too new";
        goto error;
    } else {
        error = "not a PuTTY SSH-2 private key";
        goto error;
    }
    error = "file format error";
    if ((b = read_body(src)) == NULL)
        goto error;
    /* Select key algorithm structure. */
    alg = find_pubkey_alg(b);
    if (!alg) {
        sfree(b);
        goto error;
    }
    sfree(b);

    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption"))
        goto error;
    if ((encryption = read_body(src)) == NULL)
        goto error;
    if (!strcmp(encryption, "aes256-cbc")) {
        ciphertype = &ppk_cipher_aes256_cbc;
    } else if (!strcmp(encryption, "none")) {
        ciphertype = &ppk_cipher_none;
    } else {
        goto error;
    }

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment"))
        goto error;
    if ((comment = read_body(src)) == NULL)
        goto error;

    memset(&params, 0, sizeof(params)); /* in particular, sets
                                         * passes_auto=false */

    /* Read the Public-Lines header line and the public blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Public-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    public_blob = strbuf_new();
    if (!read_blob(src, i, BinarySink_UPCAST(public_blob)))
        goto error;

    if (fmt_version >= 3 && ciphertype->keylen != 0) {
        /* Read Argon2 key derivation parameters. */
        if (!read_header(src, header) || 0 != strcmp(header, "Key-Derivation"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!strcmp(b, "Argon2d")) {
            params.argon2_flavour = Argon2d;
        } else if (!strcmp(b, "Argon2i")) {
            params.argon2_flavour = Argon2i;
        } else if (!strcmp(b, "Argon2id")) {
            params.argon2_flavour = Argon2id;
        } else {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Memory"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_mem)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Passes"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_passes)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) ||
            0 != strcmp(header, "Argon2-Parallelism"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_parallelism)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Salt"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        for (size_t i = 0; b[i]; i += 2) {
            if (isxdigit((unsigned char)b[i]) && b[i+1] &&
                isxdigit((unsigned char)b[i+1])) {
                char s[3];
                s[0] = b[i];
                s[1] = b[i+1];
                s[2] = '\0';
                put_byte(passphrase_salt, strtoul(s, NULL, 16));
            } else {
                sfree(b);
                goto error;
            }
        }
        sfree(b);
    }

    /* Read the Private-Lines header line and the Private blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Private-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    private_blob = strbuf_new_nm();
    if (!read_blob(src, i, BinarySink_UPCAST(private_blob)))
        goto error;

    /* Read the Private-MAC or Private-Hash header line. */
    if (!read_header(src, header))
        goto error;
    if (0 == strcmp(header, "Private-MAC")) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = true;
    } else if (0 == strcmp(header, "Private-Hash") && fmt_version == 1) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = false;
    } else
        goto error;

    cipher_mac_keys_blob = strbuf_new();
    ssh2_ppk_derive_keys(fmt_version, ciphertype,
                         ptrlen_from_asciz(passphrase ? passphrase : ""),
                         cipher_mac_keys_blob, &cipherkey, &cipheriv, &mackey,
                         ptrlen_from_strbuf(passphrase_salt), &params);

    /*
     * Decrypt the private blob.
     */
    if (private_blob->len % ciphertype->blocklen)
        goto error;
    if (ciphertype == &ppk_cipher_aes256_cbc) {
        aes256_decrypt_pubkey(cipherkey.ptr, cipheriv.ptr,
                              private_blob->u, private_blob->len);
    }

    /*
     * Verify the MAC.
     */
    {
        unsigned char binary[32];
        char realmac[sizeof(binary) * 2 + 1];
        strbuf *macdata;
        bool free_macdata;

        const ssh2_macalg *mac_alg =
            fmt_version <= 2 ? &ssh_hmac_sha1 : &ssh_hmac_sha256;

        if (fmt_version == 1) {
            /* MAC (or hash) only covers the private blob. */
            macdata = private_blob;
            free_macdata = false;
        } else {
            macdata = strbuf_new_nm();
            put_stringz(macdata, alg->ssh_id);
            put_stringz(macdata, encryption);
            put_stringz(macdata, comment);
            put_string(macdata, public_blob->s,
                       public_blob->len);
            put_string(macdata, private_blob->s,
                       private_blob->len);
            free_macdata = true;
        }

        if (is_mac) {
            ssh2_mac *mac;

            mac = ssh2_mac_new(mac_alg, NULL);
            ssh2_mac_setkey(mac, mackey);
            ssh2_mac_start(mac);
            put_data(mac, macdata->s, macdata->len);
            ssh2_mac_genresult(mac, binary);
            ssh2_mac_free(mac);
        } else {
            hash_simple(&ssh_sha1, ptrlen_from_strbuf(macdata), binary);
        }

        if (free_macdata)
            strbuf_free(macdata);

        for (i = 0; i < mac_alg->len; i++)
            sprintf(realmac + 2 * i, "%02x", binary[i]);

        if (strcmp(mac, realmac)) {
            /* An incorrect MAC is an unconditional Error if the key is
             * unencrypted. Otherwise, it means Wrong Passphrase. */
            if (ciphertype->keylen != 0) {
                error = "wrong passphrase";
                ret = SSH2_WRONG_PASSPHRASE;
            } else {
                error = "MAC failed";
                ret = NULL;
            }
            goto error;
        }
    }

    /*
     * Create and return the key.
     */
    ret = snew(ssh2_userkey);
    ret->comment = comment;
    comment = NULL;
    ret->key = ssh_key_new_priv(
        alg, ptrlen_from_strbuf(public_blob),
        ptrlen_from_strbuf(private_blob));
    if (!ret->key) {
        sfree(ret);
        ret = NULL;
        error = "createkey failed";
        goto error;
    }
    error = NULL;

    /*
     * Error processing.
     */
  error:
    if (comment)
        sfree(comment);
    if (encryption)
        sfree(encryption);
    if (mac)
        sfree(mac);
    if (public_blob)
        strbuf_free(public_blob);
    if (private_blob)
        strbuf_free(private_blob);
    if (cipher_mac_keys_blob)
        strbuf_free(cipher_mac_keys_blob);
    strbuf_free(passphrase_salt);
    if (errorstr)
        *errorstr = error;
    return ret;
}